

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ushort uVar1;
  int *piVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  short sVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  int16_t iVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint local_300;
  uint local_2f8;
  uint local_298;
  uint local_290;
  uint local_288;
  undefined1 local_280 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  short local_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short sStack_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short sStack_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  int16_t local_180;
  int16_t iStack_17e;
  int16_t iStack_17c;
  int16_t iStack_17a;
  int16_t iStack_178;
  int16_t iStack_176;
  int16_t iStack_174;
  int16_t iStack_172;
  int16_t iStack_170;
  int16_t iStack_16e;
  int16_t iStack_16c;
  int16_t iStack_16a;
  int16_t iStack_168;
  int16_t iStack_166;
  int16_t iStack_164;
  int16_t iStack_162;
  undefined1 local_160 [32];
  undefined2 local_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined1 local_100 [32];
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_avx2_256_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_diag_avx2_256_16_cold_6();
  }
  else if (open < 0) {
    parasail_sw_diag_avx2_256_16_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_diag_avx2_256_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_diag_avx2_256_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_diag_avx2_256_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_diag_avx2_256_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    iVar16 = matrix->min;
    iVar21 = -iVar16;
    if (iVar16 != -open && SBORROW4(iVar16,-open) == iVar16 + open < 0) {
      iVar21 = open;
    }
    uVar25 = iVar21 - 0x7fff;
    sVar12 = 0x7ffe - (short)matrix->max;
    iVar36 = (int16_t)uVar25;
    local_160._2_2_ = iVar36;
    local_160._0_2_ = iVar36;
    local_160._4_2_ = iVar36;
    local_160._6_2_ = iVar36;
    local_160._8_2_ = iVar36;
    local_160._10_2_ = iVar36;
    local_160._12_2_ = iVar36;
    local_160._14_2_ = iVar36;
    local_160._16_2_ = iVar36;
    local_160._18_2_ = iVar36;
    local_160._20_2_ = iVar36;
    local_160._22_2_ = iVar36;
    local_160._24_2_ = iVar36;
    local_160._26_2_ = iVar36;
    local_160._28_2_ = iVar36;
    local_160._30_2_ = iVar36;
    local_200._2_2_ = iVar36;
    local_200._0_2_ = iVar36;
    local_200._4_2_ = iVar36;
    local_200._6_2_ = iVar36;
    local_200._8_2_ = iVar36;
    local_200._10_2_ = iVar36;
    local_200._12_2_ = iVar36;
    local_200._14_2_ = iVar36;
    local_200._16_2_ = iVar36;
    local_200._18_2_ = iVar36;
    local_200._20_2_ = iVar36;
    local_200._22_2_ = iVar36;
    local_200._24_2_ = iVar36;
    local_200._26_2_ = iVar36;
    local_200._28_2_ = iVar36;
    local_200._30_2_ = iVar36;
    local_220._2_2_ = iVar36;
    local_220._0_2_ = iVar36;
    local_220._4_2_ = iVar36;
    local_220._6_2_ = iVar36;
    local_220._8_2_ = iVar36;
    local_220._10_2_ = iVar36;
    local_220._12_2_ = iVar36;
    local_220._14_2_ = iVar36;
    local_220._16_2_ = iVar36;
    local_220._18_2_ = iVar36;
    local_220._20_2_ = iVar36;
    local_220._22_2_ = iVar36;
    local_220._24_2_ = iVar36;
    local_220._26_2_ = iVar36;
    local_220._28_2_ = iVar36;
    local_220._30_2_ = iVar36;
    local_180 = iVar36;
    iStack_17e = iVar36;
    iStack_17c = iVar36;
    iStack_17a = iVar36;
    iStack_178 = iVar36;
    iStack_176 = iVar36;
    iStack_174 = iVar36;
    iStack_172 = iVar36;
    iStack_170 = iVar36;
    iStack_16e = iVar36;
    iStack_16c = iVar36;
    iStack_16a = iVar36;
    iStack_168 = iVar36;
    iStack_166 = iVar36;
    iStack_164 = iVar36;
    iStack_162 = iVar36;
    ppVar17 = parasail_result_new();
    if (ppVar17 != (parasail_result_t *)0x0) {
      ppVar17->flag = ppVar17->flag | 0x10201004;
      uVar22 = (ulong)(s2Len + 0x1e);
      ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar22);
      ptr_00 = parasail_memalign_int16_t(0x20,uVar22);
      ptr_01 = parasail_memalign_int16_t(0x20,uVar22);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (undefined1 (*) [16])0x0))
      {
        if (matrix->type == 0) {
          iVar16 = _s1Len + 0xf;
          ptr_02 = parasail_memalign_int16_t(0x20,(long)iVar16);
          if (ptr_02 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar2 = matrix->mapper;
            uVar22 = 0;
            do {
              ptr_02[uVar22] = (int16_t)piVar2[(byte)_s1[uVar22]];
              uVar22 = uVar22 + 1;
            } while ((uint)_s1Len != uVar22);
          }
          iVar21 = _s1Len + 1U;
          if ((int)(_s1Len + 1U) < iVar16) {
            iVar21 = iVar16;
          }
          memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar21) * 2 + 2);
        }
        else {
          ptr_02 = (int16_t *)0x0;
        }
        uVar34 = s2Len + 0xf;
        auVar5._2_2_ = iStack_17e;
        auVar5._0_2_ = local_180;
        auVar5._4_2_ = iStack_17c;
        auVar5._6_2_ = iStack_17a;
        auVar5._8_2_ = iStack_178;
        auVar5._10_2_ = iStack_176;
        auVar5._12_2_ = iStack_174;
        auVar5._14_2_ = iStack_172;
        auVar10._16_2_ = iStack_170;
        auVar10._0_16_ = auVar5;
        auVar10._18_2_ = iStack_16e;
        auVar10._20_2_ = iStack_16c;
        auVar10._22_2_ = iStack_16a;
        auVar10._24_2_ = iStack_168;
        auVar10._26_2_ = iStack_166;
        auVar10._28_2_ = iStack_164;
        auVar10._30_2_ = iStack_162;
        auVar37 = vpslldq_avx2(ZEXT1632(auVar5),0xe);
        local_100 = vpblendw_avx2(auVar10,auVar37,0x80);
        local_80 = (undefined2)open;
        local_a0 = (undefined2)gap;
        local_120 = (undefined2)_s1Len;
        local_c0 = (undefined2)s2Len;
        piVar2 = matrix->mapper;
        uVar19 = (ulong)(uint)s2Len;
        uVar22 = 0;
        do {
          *(short *)(ptr[1] + uVar22 * 2 + 0xe) = (short)piVar2[(byte)_s2[uVar22]];
          uVar22 = uVar22 + 1;
        } while (uVar19 != uVar22);
        *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar13 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar34) {
          uVar13 = uVar34;
        }
        uVar22 = 0;
        local_1e0 = sVar12;
        sStack_1de = sVar12;
        sStack_1dc = sVar12;
        sStack_1da = sVar12;
        sStack_1d8 = sVar12;
        sStack_1d6 = sVar12;
        sStack_1d4 = sVar12;
        sStack_1d2 = sVar12;
        sStack_1d0 = sVar12;
        sStack_1ce = sVar12;
        sStack_1cc = sVar12;
        sStack_1ca = sVar12;
        sStack_1c8 = sVar12;
        sStack_1c6 = sVar12;
        sStack_1c4 = sVar12;
        sStack_1c2 = sVar12;
        uStack_11e = local_120;
        uStack_11c = local_120;
        uStack_11a = local_120;
        uStack_118 = local_120;
        uStack_116 = local_120;
        uStack_114 = local_120;
        uStack_112 = local_120;
        uStack_110 = local_120;
        uStack_10e = local_120;
        uStack_10c = local_120;
        uStack_10a = local_120;
        uStack_108 = local_120;
        uStack_106 = local_120;
        uStack_104 = local_120;
        uStack_102 = local_120;
        uStack_be = local_c0;
        uStack_bc = local_c0;
        uStack_ba = local_c0;
        uStack_b8 = local_c0;
        uStack_b6 = local_c0;
        uStack_b4 = local_c0;
        uStack_b2 = local_c0;
        uStack_b0 = local_c0;
        uStack_ae = local_c0;
        uStack_ac = local_c0;
        uStack_aa = local_c0;
        uStack_a8 = local_c0;
        uStack_a6 = local_c0;
        uStack_a4 = local_c0;
        uStack_a2 = local_c0;
        uStack_9e = local_a0;
        uStack_9c = local_a0;
        uStack_9a = local_a0;
        uStack_98 = local_a0;
        uStack_96 = local_a0;
        uStack_94 = local_a0;
        uStack_92 = local_a0;
        uStack_90 = local_a0;
        uStack_8e = local_a0;
        uStack_8c = local_a0;
        uStack_8a = local_a0;
        uStack_88 = local_a0;
        uStack_86 = local_a0;
        uStack_84 = local_a0;
        uStack_82 = local_a0;
        uStack_7e = local_80;
        uStack_7c = local_80;
        uStack_7a = local_80;
        uStack_78 = local_80;
        uStack_76 = local_80;
        uStack_74 = local_80;
        uStack_72 = local_80;
        uStack_70 = local_80;
        uStack_6e = local_80;
        uStack_6c = local_80;
        uStack_6a = local_80;
        uStack_68 = local_80;
        uStack_66 = local_80;
        uStack_64 = local_80;
        uStack_62 = local_80;
        memset(ptr[1] + uVar19 * 2 + 0xe,0,(ulong)(~s2Len + uVar13) * 2 + 2);
        do {
          ptr_00[uVar22 + 0xf] = 0;
          ptr_01[uVar22 + 0xf] = iVar36;
          uVar22 = uVar22 + 1;
        } while (uVar19 != uVar22);
        lVar18 = 0;
        do {
          ptr_00[lVar18] = iVar36;
          ptr_01[lVar18] = iVar36;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0xf);
        lVar18 = uVar19 + 0xf;
        auVar37._2_2_ = iStack_17e;
        auVar37._0_2_ = local_180;
        auVar37._4_2_ = iStack_17c;
        auVar37._6_2_ = iStack_17a;
        auVar37._8_2_ = iStack_178;
        auVar37._10_2_ = iStack_176;
        auVar37._12_2_ = iStack_174;
        auVar37._14_2_ = iStack_172;
        auVar37._16_2_ = iStack_170;
        auVar37._18_2_ = iStack_16e;
        auVar37._20_2_ = iStack_16c;
        auVar37._22_2_ = iStack_16a;
        auVar37._24_2_ = iStack_168;
        auVar37._26_2_ = iStack_166;
        auVar37._28_2_ = iStack_164;
        auVar37._30_2_ = iStack_162;
        auVar47 = ZEXT3264(auVar37);
        do {
          ptr_00[lVar18] = iVar36;
          ptr_01[lVar18] = iVar36;
          lVar18 = lVar18 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar34);
        if (_s1Len < 1) {
          auVar39._2_2_ = sStack_1de;
          auVar39._0_2_ = local_1e0;
          auVar39._4_2_ = sStack_1dc;
          auVar39._6_2_ = sStack_1da;
          auVar39._8_2_ = sStack_1d8;
          auVar39._10_2_ = sStack_1d6;
          auVar39._12_2_ = sStack_1d4;
          auVar39._14_2_ = sStack_1d2;
          auVar39._16_2_ = sStack_1d0;
          auVar39._18_2_ = sStack_1ce;
          auVar39._20_2_ = sStack_1cc;
          auVar39._22_2_ = sStack_1ca;
          auVar39._24_2_ = sStack_1c8;
          auVar39._26_2_ = sStack_1c6;
          auVar39._28_2_ = sStack_1c4;
          auVar39._30_2_ = sStack_1c2;
          local_200 = auVar37;
          auVar46 = auVar37;
        }
        else {
          piVar2 = matrix->matrix;
          iVar16 = matrix->size;
          uVar13 = _s1Len - 1;
          uVar22 = 1;
          if (1 < (int)uVar34) {
            uVar22 = (ulong)uVar34;
          }
          uVar19 = (ulong)(uint)_s1Len;
          auVar41 = ZEXT3264(local_160);
          local_280._8_8_ = 0x80009000a000b;
          local_280._0_8_ = 0xc000d000e000f;
          local_280._16_8_ = 0x4000500060007;
          local_280._24_8_ = 0x100020003;
          auVar42 = ZEXT3264(local_220);
          uVar28 = 0;
          local_e0 = 1;
          uStack_de = 1;
          uStack_dc = 1;
          uStack_da = 1;
          uStack_d8 = 1;
          uStack_d6 = 1;
          uStack_d4 = 1;
          uStack_d2 = 1;
          uStack_d0 = 1;
          uStack_ce = 1;
          uStack_cc = 1;
          uStack_ca = 1;
          uStack_c8 = 1;
          uStack_c6 = 1;
          uStack_c4 = 1;
          uStack_c2 = 1;
          local_140 = 0x10;
          uStack_13e = 0x10;
          uStack_13c = 0x10;
          uStack_13a = 0x10;
          uStack_138 = 0x10;
          uStack_136 = 0x10;
          uStack_134 = 0x10;
          uStack_132 = 0x10;
          uStack_130 = 0x10;
          uStack_12e = 0x10;
          uStack_12c = 0x10;
          uStack_12a = 0x10;
          uStack_128 = 0x10;
          uStack_126 = 0x10;
          uStack_124 = 0x10;
          uStack_122 = 0x10;
          local_1c0._2_2_ = sStack_1de;
          local_1c0._0_2_ = local_1e0;
          local_1c0._4_2_ = sStack_1dc;
          local_1c0._6_2_ = sStack_1da;
          local_1c0._10_2_ = sStack_1d6;
          local_1c0._8_2_ = sStack_1d8;
          local_1c0._12_2_ = sStack_1d4;
          local_1c0._14_2_ = sStack_1d2;
          local_1c0._18_2_ = sStack_1ce;
          local_1c0._16_2_ = sStack_1d0;
          local_1c0._20_2_ = sStack_1cc;
          local_1c0._22_2_ = sStack_1ca;
          local_1c0._26_2_ = sStack_1c6;
          local_1c0._24_2_ = sStack_1c8;
          local_1c0._28_2_ = sStack_1c4;
          local_1c0._30_2_ = sStack_1c2;
          local_1a0 = auVar37;
          auVar43 = ZEXT3264(auVar37);
          do {
            if (matrix->type == 0) {
              local_300 = (uint)ptr_02[uVar28 + 1];
              local_288 = (uint)ptr_02[uVar28 + 2];
              local_2f8 = (uint)ptr_02[uVar28 + 3];
              local_290 = (uint)ptr_02[uVar28 + 4];
              uVar30 = (uint)ptr_02[uVar28 + 5];
              local_298 = (uint)ptr_02[uVar28 + 6];
              uVar29 = (uint)ptr_02[uVar28 + 7];
              uVar35 = (uint)ptr_02[uVar28 + 8];
              uVar33 = (uint)ptr_02[uVar28 + 9];
              uVar32 = (uint)ptr_02[uVar28 + 10];
              uVar20 = (uint)ptr_02[uVar28 + 0xb];
              uVar23 = (uint)ptr_02[uVar28 + 0xc];
              uVar14 = (uint)ptr_02[uVar28 + 0xd];
              uVar31 = (uint)ptr_02[uVar28 + 0xe];
              uVar27 = (ulong)(uint)(int)ptr_02[uVar28];
              uVar34 = (int)ptr_02[uVar28 + 0xf];
            }
            else {
              uVar34 = (uint)uVar28;
              local_300 = uVar34 | 1;
              if (uVar19 <= (uVar28 | 1)) {
                local_300 = uVar13;
              }
              local_288 = uVar34 | 2;
              if (uVar19 <= (uVar28 | 2)) {
                local_288 = uVar13;
              }
              local_2f8 = uVar34 | 3;
              if (uVar19 <= (uVar28 | 3)) {
                local_2f8 = uVar13;
              }
              local_290 = uVar34 | 4;
              if (uVar19 <= (uVar28 | 4)) {
                local_290 = uVar13;
              }
              uVar30 = uVar34 | 5;
              if (uVar19 <= (uVar28 | 5)) {
                uVar30 = uVar13;
              }
              local_298 = uVar34 | 6;
              if (uVar19 <= (uVar28 | 6)) {
                local_298 = uVar13;
              }
              uVar29 = uVar34 | 7;
              if (uVar19 <= (uVar28 | 7)) {
                uVar29 = uVar13;
              }
              uVar35 = uVar34 | 8;
              if (uVar19 <= (uVar28 | 8)) {
                uVar35 = uVar13;
              }
              uVar33 = uVar34 | 9;
              if (uVar19 <= (uVar28 | 9)) {
                uVar33 = uVar13;
              }
              uVar32 = uVar34 | 10;
              if (uVar19 <= (uVar28 | 10)) {
                uVar32 = uVar13;
              }
              uVar20 = uVar34 | 0xb;
              if (uVar19 <= (uVar28 | 0xb)) {
                uVar20 = uVar13;
              }
              uVar23 = uVar34 | 0xc;
              if (uVar19 <= (uVar28 | 0xc)) {
                uVar23 = uVar13;
              }
              uVar14 = uVar34 | 0xd;
              if (uVar19 <= (uVar28 | 0xd)) {
                uVar14 = uVar13;
              }
              uVar31 = uVar34 | 0xe;
              if (uVar19 <= (uVar28 | 0xe)) {
                uVar31 = uVar13;
              }
              uVar27 = uVar28;
              uVar34 = uVar34 | 0xf;
              if (uVar19 <= (uVar28 | 0xf)) {
                uVar34 = uVar13;
              }
            }
            auVar45._2_2_ = uStack_11e;
            auVar45._0_2_ = local_120;
            auVar45._4_2_ = uStack_11c;
            auVar45._6_2_ = uStack_11a;
            auVar45._8_2_ = uStack_118;
            auVar45._10_2_ = uStack_116;
            auVar45._12_2_ = uStack_114;
            auVar45._14_2_ = uStack_112;
            auVar45._16_2_ = uStack_110;
            auVar45._18_2_ = uStack_10e;
            auVar45._20_2_ = uStack_10c;
            auVar45._22_2_ = uStack_10a;
            auVar45._24_2_ = uStack_108;
            auVar45._26_2_ = uStack_106;
            auVar45._28_2_ = uStack_104;
            auVar45._30_2_ = uStack_102;
            auVar8 = vpcmpgtw_avx2(auVar45,local_280);
            auVar10 = vpmovsxbw_avx2(_DAT_0090923c);
            auVar45 = auVar47._0_32_;
            uVar24 = 0;
            auVar37 = local_100;
            auVar7 = local_100;
            auVar39 = auVar45;
            do {
              auVar5 = vpinsrw_avx(ZEXT416((uint)piVar2[(long)(int)(uVar29 * iVar16) +
                                                        (long)*(short *)(ptr[1] + uVar24 * 2)]),
                                   (uint)*(ushort *)
                                          (piVar2 + (long)(int)(local_298 * iVar16) +
                                                    (long)*(short *)(ptr[1] + uVar24 * 2 + 2)),1);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar30 * iVar16) +
                                                           (long)*(short *)(ptr[1] + uVar24 * 2 + 4)
                                                 ),2);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(local_290 * iVar16) +
                                                           (long)*(short *)(ptr[1] + uVar24 * 2 + 6)
                                                 ),3);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(local_2f8 * iVar16) +
                                                           (long)*(short *)(ptr[1] + uVar24 * 2 + 8)
                                                 ),4);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(local_288 * iVar16) +
                                                           (long)*(short *)(ptr[1] + uVar24 * 2 + 10
                                                                           )),5);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(local_300 * iVar16) +
                                                           (long)*(short *)(ptr[1] + uVar24 * 2 +
                                                                                     0xc)),6);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)((int)uVar27 * iVar16) +
                                                           (long)*(short *)(ptr[1] + uVar24 * 2 +
                                                                                     0xe)),7);
              auVar6 = vpinsrw_avx(ZEXT416((uint)piVar2[(long)(int)(uVar34 * iVar16) +
                                                        (long)*(short *)(*ptr + uVar24 * 2)]),
                                   (uint)*(ushort *)
                                          (piVar2 + (long)(int)(uVar31 * iVar16) +
                                                    (long)*(short *)(*ptr + uVar24 * 2 + 2)),1);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar14 * iVar16) +
                                                           (long)*(short *)(*ptr + uVar24 * 2 + 4)),
                                   2);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar23 * iVar16) +
                                                           (long)*(short *)(*ptr + uVar24 * 2 + 6)),
                                   3);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar20 * iVar16) +
                                                           (long)*(short *)(*ptr + uVar24 * 2 + 8)),
                                   4);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar32 * iVar16) +
                                                           (long)*(short *)(*ptr + uVar24 * 2 + 10))
                                   ,5);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar33 * iVar16) +
                                                           (long)*(short *)(*ptr + uVar24 * 2 + 0xc)
                                                 ),6);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar35 * iVar16) +
                                                           (long)*(short *)(*ptr + uVar24 * 2 + 0xe)
                                                 ),7);
              auVar44._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar6;
              auVar44._16_16_ = ZEXT116(1) * auVar5;
              auVar46 = vpaddsw_avx2(auVar7,auVar44);
              iVar36 = ptr_00[uVar24 + 0xf];
              auVar48._2_2_ = iVar36;
              auVar48._0_2_ = iVar36;
              auVar48._4_2_ = iVar36;
              auVar48._6_2_ = iVar36;
              auVar48._8_2_ = iVar36;
              auVar48._10_2_ = iVar36;
              auVar48._12_2_ = iVar36;
              auVar48._14_2_ = iVar36;
              auVar48._16_2_ = iVar36;
              auVar48._18_2_ = iVar36;
              auVar48._20_2_ = iVar36;
              auVar48._22_2_ = iVar36;
              auVar48._24_2_ = iVar36;
              auVar48._26_2_ = iVar36;
              auVar48._28_2_ = iVar36;
              auVar48._30_2_ = iVar36;
              auVar7 = vpalignr_avx2(ZEXT1632(auVar37._16_16_),auVar37,2);
              auVar44 = vpblendw_avx2(auVar7,auVar48,0x80);
              auVar7 = vpblendd_avx2(auVar7,auVar44,0xf0);
              auVar39 = vpalignr_avx2(ZEXT1632(auVar39._16_16_),auVar39,2);
              iVar36 = ptr_01[uVar24 + 0xf];
              auVar49._2_2_ = iVar36;
              auVar49._0_2_ = iVar36;
              auVar49._4_2_ = iVar36;
              auVar49._6_2_ = iVar36;
              auVar49._8_2_ = iVar36;
              auVar49._10_2_ = iVar36;
              auVar49._12_2_ = iVar36;
              auVar49._14_2_ = iVar36;
              auVar49._16_2_ = iVar36;
              auVar49._18_2_ = iVar36;
              auVar49._20_2_ = iVar36;
              auVar49._22_2_ = iVar36;
              auVar49._24_2_ = iVar36;
              auVar49._26_2_ = iVar36;
              auVar49._28_2_ = iVar36;
              auVar49._30_2_ = iVar36;
              auVar44 = vpblendw_avx2(auVar39,auVar49,0x80);
              auVar44 = vpblendd_avx2(auVar39,auVar44,0xf0);
              auVar38._2_2_ = uStack_7e;
              auVar38._0_2_ = local_80;
              auVar38._4_2_ = uStack_7c;
              auVar38._6_2_ = uStack_7a;
              auVar38._8_2_ = uStack_78;
              auVar38._10_2_ = uStack_76;
              auVar38._12_2_ = uStack_74;
              auVar38._14_2_ = uStack_72;
              auVar38._16_2_ = uStack_70;
              auVar38._18_2_ = uStack_6e;
              auVar38._20_2_ = uStack_6c;
              auVar38._22_2_ = uStack_6a;
              auVar38._24_2_ = uStack_68;
              auVar38._26_2_ = uStack_66;
              auVar38._28_2_ = uStack_64;
              auVar38._30_2_ = uStack_62;
              auVar39 = vpsubsw_avx2(auVar7,auVar38);
              auVar9._2_2_ = uStack_9e;
              auVar9._0_2_ = local_a0;
              auVar9._4_2_ = uStack_9c;
              auVar9._6_2_ = uStack_9a;
              auVar9._8_2_ = uStack_98;
              auVar9._10_2_ = uStack_96;
              auVar9._12_2_ = uStack_94;
              auVar9._14_2_ = uStack_92;
              auVar9._16_2_ = uStack_90;
              auVar9._18_2_ = uStack_8e;
              auVar9._20_2_ = uStack_8c;
              auVar9._22_2_ = uStack_8a;
              auVar9._24_2_ = uStack_88;
              auVar9._26_2_ = uStack_86;
              auVar9._28_2_ = uStack_84;
              auVar9._30_2_ = uStack_82;
              auVar44 = vpsubsw_avx2(auVar44,auVar9);
              auVar39 = vpmaxsw_avx2(auVar39,auVar44);
              auVar37 = vpsubsw_avx2(auVar37,auVar38);
              auVar45 = vpsubsw_avx2(auVar45,auVar9);
              auVar44 = vpmaxsw_avx2(auVar37,auVar45);
              auVar37 = vpmaxsw_avx2(auVar39,auVar44);
              auVar37 = vpmaxsw_avx2(auVar37,_DAT_00908c40);
              auVar46 = vpmaxsw_avx2(auVar37,auVar46);
              auVar45 = vpcmpeqw_avx2(auVar10,_DAT_00909280);
              auVar37 = vpandn_avx2(auVar45,auVar46);
              auVar39 = vpblendvb_avx2(auVar39,auVar47._0_32_,auVar45);
              if (0xf < uVar24) {
                local_1c0 = vpminsw_avx2(auVar37,local_1c0);
                local_1a0 = vpmaxsw_avx2(auVar37,local_1a0);
              }
              auVar11._2_2_ = uStack_be;
              auVar11._0_2_ = local_c0;
              auVar11._4_2_ = uStack_bc;
              auVar11._6_2_ = uStack_ba;
              auVar11._8_2_ = uStack_b8;
              auVar11._10_2_ = uStack_b6;
              auVar11._12_2_ = uStack_b4;
              auVar11._14_2_ = uStack_b2;
              auVar11._16_2_ = uStack_b0;
              auVar11._18_2_ = uStack_ae;
              auVar11._20_2_ = uStack_ac;
              auVar11._22_2_ = uStack_aa;
              auVar11._24_2_ = uStack_a8;
              auVar11._26_2_ = uStack_a6;
              auVar11._28_2_ = uStack_a4;
              auVar11._30_2_ = uStack_a2;
              auVar9 = vpcmpgtw_avx2(auVar11,auVar10);
              auVar9 = vpand_avx2(auVar9,auVar8);
              auVar38 = vpsraw_avx2(auVar10,0xf);
              auVar38 = vpandn_avx2(auVar38,auVar9);
              auVar5 = vpacksswb_avx(auVar38._0_16_,auVar38._16_16_);
              auVar40 = auVar41._0_32_;
              auVar48 = vpcmpeqw_avx2(auVar37,auVar40);
              auVar49 = vpcmpgtw_avx2(auVar37,auVar40);
              auVar9 = vpand_avx2(auVar49,auVar38);
              local_160 = vpblendvb_avx2(auVar40,auVar46,auVar9);
              auVar41 = ZEXT3264(local_160);
              auVar6 = vpacksswb_avx(auVar9._0_16_,auVar9._16_16_);
              auVar46 = vpcmpgtw_avx2(auVar42._0_32_,auVar10);
              auVar9 = vpand_avx2(auVar46,auVar48);
              auVar4 = vpacksswb_avx(auVar9._0_16_,auVar9._16_16_);
              auVar5 = vpblendvb_avx(auVar6,auVar5,auVar4);
              auVar46._2_2_ = iStack_17e;
              auVar46._0_2_ = local_180;
              auVar46._4_2_ = iStack_17c;
              auVar46._6_2_ = iStack_17a;
              auVar46._8_2_ = iStack_178;
              auVar46._10_2_ = iStack_176;
              auVar46._12_2_ = iStack_174;
              auVar46._14_2_ = iStack_172;
              auVar46._16_2_ = iStack_170;
              auVar46._18_2_ = iStack_16e;
              auVar46._20_2_ = iStack_16c;
              auVar46._22_2_ = iStack_16a;
              auVar46._24_2_ = iStack_168;
              auVar46._26_2_ = iStack_166;
              auVar46._28_2_ = iStack_164;
              auVar46._30_2_ = iStack_162;
              auVar47 = ZEXT3264(auVar46);
              auVar45 = vpblendvb_avx2(auVar44,auVar46,auVar45);
              auVar44 = vpmovsxbw_avx2(auVar5);
              local_200 = vpblendvb_avx2(auVar43._0_32_,local_280,auVar44);
              auVar43 = ZEXT3264(local_200);
              auVar44 = vpor_avx2(auVar49,auVar9);
              auVar44 = vpand_avx2(auVar38,auVar44);
              local_220 = vpblendvb_avx2(auVar42._0_32_,auVar10,auVar44);
              auVar42 = ZEXT3264(local_220);
              vpextrw_avx(auVar37._0_16_,0);
              vpextrw_avx(auVar39._0_16_,0);
              auVar40._8_2_ = 1;
              auVar40._0_8_ = 0x1000100010001;
              auVar40._10_2_ = 1;
              auVar40._12_2_ = 1;
              auVar40._14_2_ = 1;
              auVar40._16_2_ = 1;
              auVar40._18_2_ = 1;
              auVar40._20_2_ = 1;
              auVar40._22_2_ = 1;
              auVar40._24_2_ = 1;
              auVar40._26_2_ = 1;
              auVar40._28_2_ = 1;
              auVar40._30_2_ = 1;
              auVar10 = vpaddsw_avx2(auVar10,auVar40);
              uVar24 = uVar24 + 1;
            } while (uVar22 != uVar24);
            auVar8._8_2_ = 0x10;
            auVar8._0_8_ = 0x10001000100010;
            auVar8._10_2_ = 0x10;
            auVar8._12_2_ = 0x10;
            auVar8._14_2_ = 0x10;
            auVar8._16_2_ = 0x10;
            auVar8._18_2_ = 0x10;
            auVar8._20_2_ = 0x10;
            auVar8._22_2_ = 0x10;
            auVar8._24_2_ = 0x10;
            auVar8._26_2_ = 0x10;
            auVar8._28_2_ = 0x10;
            auVar8._30_2_ = 0x10;
            local_280 = vpaddsw_avx2(local_280,auVar8);
            uVar28 = uVar28 + 0x10;
          } while (uVar28 < uVar19);
          auVar39 = local_1c0;
          auVar37 = local_1a0;
        }
        lVar18 = 0;
        iVar15 = 0;
        iVar16 = 0;
        iVar21 = 0;
        do {
          uVar1 = *(ushort *)(local_160 + lVar18 * 2);
          if ((short)(ushort)uVar25 < (short)uVar1) {
            uVar25 = (uint)uVar1;
            iVar16 = (int)*(short *)(local_200 + lVar18 * 2);
            iVar21 = (int)*(short *)(local_220 + lVar18 * 2);
            iVar15 = (int)*(short *)(local_200 + lVar18 * 2);
          }
          else if (uVar1 == (ushort)uVar25) {
            iVar26 = (int)*(short *)(local_220 + lVar18 * 2);
            if (iVar26 < iVar21) {
              iVar16 = (int)*(short *)(local_200 + lVar18 * 2);
              iVar21 = iVar26;
              iVar15 = (int)*(short *)(local_200 + lVar18 * 2);
            }
            else if ((iVar21 == iVar26) &&
                    (iVar26 = (int)*(short *)(local_200 + lVar18 * 2), bVar3 = iVar26 <= iVar16,
                    iVar16 = iVar15, bVar3)) {
              iVar16 = iVar26;
              iVar15 = iVar26;
            }
          }
          sVar12 = (short)uVar25;
          lVar18 = lVar18 + 1;
        } while ((int)lVar18 != 0x10);
        auVar10 = vpcmpgtw_avx2(auVar46,auVar39);
        auVar7._2_2_ = sStack_1de;
        auVar7._0_2_ = local_1e0;
        auVar7._4_2_ = sStack_1dc;
        auVar7._6_2_ = sStack_1da;
        auVar7._8_2_ = sStack_1d8;
        auVar7._10_2_ = sStack_1d6;
        auVar7._12_2_ = sStack_1d4;
        auVar7._14_2_ = sStack_1d2;
        auVar7._16_2_ = sStack_1d0;
        auVar7._18_2_ = sStack_1ce;
        auVar7._20_2_ = sStack_1cc;
        auVar7._22_2_ = sStack_1ca;
        auVar7._24_2_ = sStack_1c8;
        auVar7._26_2_ = sStack_1c6;
        auVar7._28_2_ = sStack_1c4;
        auVar7._30_2_ = sStack_1c2;
        auVar37 = vpcmpgtw_avx2(auVar37,auVar7);
        auVar10 = vpor_avx2(auVar10,auVar37);
        if ((((((((((((((((((((((((((((((((auVar10 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar10 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar10 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar10 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar10 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar10 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar10 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar10 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar10 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar10 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar10 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar10 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar10 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar10 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar10 >> 0x7f,0) != '\0') ||
                          (auVar10 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar10 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar10 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar10 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0xbf,0) != '\0') ||
                  (auVar10 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar10 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar10 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar10 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
          sVar12 = 0;
          iVar21 = 0;
          iVar16 = 0;
        }
        ppVar17->score = (int)sVar12;
        ppVar17->end_query = iVar16;
        ppVar17->end_ref = iVar21;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar17;
        }
        return ppVar17;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}